

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFab.cpp
# Opt level: O2

Real __thiscall amrex::MultiFab::sum_unique(MultiFab *this,int comp,bool local,Periodicity *period)

{
  undefined8 this_00;
  IndexType IVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  double dVar10;
  Real RVar11;
  double dVar12;
  double local_160;
  undefined1 local_158 [72];
  Array4<const_double> local_110;
  Array4<const_int> local_d0;
  MFIter mfi;
  
  IVar1 = BATransformer::index_type
                    (&(this->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat);
  if (IVar1.itype == 0) {
    RVar11 = sum(this,comp,false);
    return RVar11;
  }
  OwnerMask((MultiFab *)local_158,(Periodicity *)this);
  MFIter::MFIter(&mfi,(FabArrayBase *)this,true);
  local_158._8_8_ = (long)comp << 3;
  local_160 = 0.0;
  local_158._16_8_ = this;
  while (this_00 = local_158._16_8_, mfi.currentIndex < mfi.endIndex) {
    MFIter::tilebox((Box *)(local_158 + 0x2c),&mfi);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_110,(FabArray<amrex::FArrayBox> *)this_00,&mfi);
    FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
              (&local_d0,(FabArray<amrex::IArrayBox> *)local_158._0_8_,&mfi);
    lVar2 = (long)(int)local_158._44_4_;
    local_158._32_8_ = SEXT48((int)local_158._48_4_);
    lVar4 = (long)(int)local_158._52_4_;
    local_158._24_8_ = local_d0.kstride * 4;
    lVar6 = (local_158._32_8_ - (long)local_d0.begin.y) * local_d0.jstride * 4 +
            (lVar4 - local_d0.begin.z) * local_158._24_8_ + lVar2 * 4 + (long)local_d0.begin.x * -4
            + (long)local_d0.p;
    lVar5 = local_110.nstride * local_158._8_8_ +
            (local_158._32_8_ - (long)local_110.begin.y) * local_110.jstride * 8 +
            (lVar4 - local_110.begin.z) * local_110.kstride * 8 + lVar2 * 8 +
            (long)local_110.begin.x * -8 + (long)local_110.p;
    dVar10 = 0.0;
    for (; lVar3 = local_158._32_8_, lVar7 = lVar6, lVar8 = lVar5, lVar4 <= (int)local_158._64_4_;
        lVar4 = lVar4 + 1) {
      for (; lVar3 <= (int)local_158._60_4_; lVar3 = lVar3 + 1) {
        for (lVar9 = 0; lVar2 + lVar9 <= (long)(int)local_158._56_4_; lVar9 = lVar9 + 1) {
          if (*(int *)(lVar7 + lVar9 * 4) == 0) {
            dVar12 = 0.0;
          }
          else {
            dVar12 = *(double *)(lVar8 + lVar9 * 8);
          }
          dVar10 = dVar10 + dVar12;
        }
        lVar7 = lVar7 + local_d0.jstride * 4;
        lVar8 = lVar8 + local_110.jstride * 8;
      }
      lVar6 = lVar6 + local_158._24_8_;
      lVar5 = lVar5 + local_110.kstride * 8;
    }
    local_160 = local_160 + dVar10;
    MFIter::operator++(&mfi);
  }
  MFIter::~MFIter(&mfi);
  if ((FabArray<amrex::IArrayBox> *)local_158._0_8_ != (FabArray<amrex::IArrayBox> *)0x0) {
    (*((FabArrayBase *)local_158._0_8_)->_vptr_FabArrayBase[1])();
  }
  return local_160;
}

Assistant:

Real
MultiFab::sum_unique (int comp,
                      bool local,
                      const Periodicity& period) const
{
    BL_PROFILE("MultiFab::sum_unique()");

    // no duplicatly distributed points if cell centered
    if (ixType().cellCentered())
        return this->sum(comp, local);

    // Owner is the grid with the lowest grid number containing the data
    std::unique_ptr<iMultiFab> owner_mask = OwnerMask(period);

    Real sm = Real(0.0);
#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion()) {
        auto const& ma = this->const_arrays();
        auto const& msk = owner_mask->const_arrays();
        sm = ParReduce(TypeList<ReduceOpSum>{}, TypeList<Real>{}, *this, IntVect(0),
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
                       -> GpuTuple<Real>
        {
            return msk[box_no](i,j,k) ? ma[box_no](i,j,k,comp) : 0.0_rt;
        });
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (!system::regtest_reduction) reduction(+:sm)
#endif
        for (MFIter mfi(*this,true); mfi.isValid(); ++mfi)
        {
            Box const& bx = mfi.tilebox();
            Array4<Real const> const& a = this->const_array(mfi);
            Array4<int const> const& msk = owner_mask->const_array(mfi);
            Real tmp = 0.0_rt;
            AMREX_LOOP_3D(bx, i, j, k,
            {
                tmp += msk(i,j,k) ? a(i,j,k,comp) : 0.0_rt;
            });
            sm += tmp; // Do it this way so that it does not break regression tests.
        }
    }

    if (!local) {
        ParallelAllReduce::Sum(sm, ParallelContext::CommunicatorSub());
    }

    return sm;
}